

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O1

HeapLeafObject * __thiscall
jsonnet::internal::anon_unknown_0::Interpreter::findObject
          (Interpreter *this,Identifier *f,HeapObject *curr,uint start_from,uint *counter)

{
  GarbageCollectionMark *pGVar1;
  uint uVar2;
  long lVar3;
  HeapLeafObject *pHVar4;
  undefined4 in_register_0000000c;
  GarbageCollectionMark *pGVar5;
  GarbageCollectionMark *pGVar6;
  bool bVar7;
  
  while( true ) {
    if (f == (Identifier *)0x0) {
      lVar3 = 0;
    }
    else {
      lVar3 = __dynamic_cast(f,&(anonymous_namespace)::HeapObject::typeinfo,
                             &(anonymous_namespace)::HeapExtendedObject::typeinfo,0);
    }
    if (lVar3 == 0) break;
    pHVar4 = findObject(this,*(Identifier **)(lVar3 + 0x18),(HeapObject *)((ulong)curr & 0xffffffff)
                        ,start_from,counter);
    if (pHVar4 != (HeapLeafObject *)0x0) {
      return pHVar4;
    }
    f = *(Identifier **)(lVar3 + 0x10);
  }
  uVar2 = *(uint *)CONCAT44(in_register_0000000c,start_from);
  if (uVar2 < (uint)curr) goto LAB_00179f4a;
  if (f == (Identifier *)0x0) {
    pHVar4 = (HeapLeafObject *)0x0;
  }
  else {
    pHVar4 = (HeapLeafObject *)
             __dynamic_cast(f,&(anonymous_namespace)::HeapObject::typeinfo,
                            &(anonymous_namespace)::HeapSimpleObject::typeinfo,0);
  }
  if (pHVar4 == (HeapLeafObject *)0x0) {
    if (f == (Identifier *)0x0) {
      pHVar4 = (HeapLeafObject *)0x0;
    }
    else {
      pHVar4 = (HeapLeafObject *)
               __dynamic_cast(f,&(anonymous_namespace)::HeapObject::typeinfo,
                              &(anonymous_namespace)::HeapComprehensionObject::typeinfo,0);
    }
    if (pHVar4 != (HeapLeafObject *)0x0) {
      pGVar1 = &pHVar4[5].super_HeapObject.super_HeapEntity.mark;
      pGVar5 = pGVar1;
      for (pGVar6 = (GarbageCollectionMark *)
                    pHVar4[6].super_HeapObject.super_HeapEntity._vptr_HeapEntity;
          pGVar6 != (GarbageCollectionMark *)0x0;
          pGVar6 = *(GarbageCollectionMark **)
                    (pGVar6 + (ulong)(*(Interpreter **)(pGVar6 + 0x20) < this) * 8 + 0x10)) {
        if (*(Interpreter **)(pGVar6 + 0x20) >= this) {
          pGVar5 = pGVar6;
        }
      }
      pGVar6 = pGVar1;
      if ((pGVar5 != pGVar1) && (pGVar6 = pGVar5, this < *(Interpreter **)(pGVar5 + 0x20))) {
        pGVar6 = pGVar1;
      }
      if (pGVar6 != pGVar1) {
        bVar7 = false;
        goto LAB_00179f46;
      }
    }
    bVar7 = true;
  }
  else {
    pGVar1 = &pHVar4[4].super_HeapObject.super_HeapEntity.mark;
    pGVar5 = pGVar1;
    for (pGVar6 = (GarbageCollectionMark *)
                  pHVar4[5].super_HeapObject.super_HeapEntity._vptr_HeapEntity;
        pGVar6 != (GarbageCollectionMark *)0x0;
        pGVar6 = *(GarbageCollectionMark **)
                  (pGVar6 + (ulong)(*(Interpreter **)(pGVar6 + 0x20) < this) * 8 + 0x10)) {
      if (*(Interpreter **)(pGVar6 + 0x20) >= this) {
        pGVar5 = pGVar6;
      }
    }
    pGVar6 = pGVar1;
    if ((pGVar5 != pGVar1) && (pGVar6 = pGVar5, this < *(Interpreter **)(pGVar5 + 0x20))) {
      pGVar6 = pGVar1;
    }
    bVar7 = pGVar6 == pGVar1;
  }
LAB_00179f46:
  if (!bVar7) {
    return pHVar4;
  }
LAB_00179f4a:
  *(uint *)CONCAT44(in_register_0000000c,start_from) = uVar2 + 1;
  return (HeapLeafObject *)0x0;
}

Assistant:

HeapLeafObject *findObject(const Identifier *f, HeapObject *curr, unsigned start_from,
                               unsigned &counter)
    {
        if (auto *ext = dynamic_cast<HeapExtendedObject *>(curr)) {
            auto *r = findObject(f, ext->right, start_from, counter);
            if (r)
                return r;
            auto *l = findObject(f, ext->left, start_from, counter);
            if (l)
                return l;
        } else {
            if (counter >= start_from) {
                if (auto *simp = dynamic_cast<HeapSimpleObject *>(curr)) {
                    auto it = simp->fields.find(f);
                    if (it != simp->fields.end()) {
                        return simp;
                    }
                } else if (auto *comp = dynamic_cast<HeapComprehensionObject *>(curr)) {
                    auto it = comp->compValues.find(f);
                    if (it != comp->compValues.end()) {
                        return comp;
                    }
                }
            }
            counter++;
        }
        return nullptr;
    }